

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,SignedType type)

{
  Enum EVar1;
  string_view local_38;
  string_view local_28;
  CWriter *local_18;
  CWriter *this_local;
  SignedType type_local;
  
  local_18 = this;
  this_local = (CWriter *)type.type;
  EVar1 = Type::operator_cast_to_Enum((Type *)&this_local);
  if (EVar1 == I64) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"s64");
    Write(this,local_38);
  }
  else {
    if (EVar1 != I32) {
      abort();
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"s32");
    Write(this,local_28);
  }
  return;
}

Assistant:

void CWriter::Write(SignedType type) {
  // clang-format off
  switch (type.type) {
    case Type::I32: Write("s32"); break;
    case Type::I64: Write("s64"); break;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}